

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O1

void __thiscall Blip_Buffer::Blip_Buffer(Blip_Buffer *this)

{
  this->factor_ = 0x7fffffff;
  *(undefined8 *)&this->offset_ = 0;
  *(undefined8 *)((long)&this->buffer_ + 4) = 0;
  this->reader_accum_ = 0;
  this->bass_shift_ = 0;
  this->sample_rate_ = 0;
  this->clock_rate_ = 0;
  this->bass_freq_ = 0x10;
  this->length_ = 0;
  return;
}

Assistant:

Blip_Buffer::Blip_Buffer()
{
	factor_       = (blip_ulong)-1 / 2;
	offset_       = 0;
	buffer_       = 0;
	buffer_size_  = 0;
	sample_rate_  = 0;
	reader_accum_ = 0;
	bass_shift_   = 0;
	clock_rate_   = 0;
	bass_freq_    = 16;
	length_       = 0;
	
	// assumptions code makes about implementation-defined features
	#ifndef NDEBUG
		// right shift of negative value preserves sign
		buf_t_ i = -0x7FFFFFFE;
		assert( (i >> 1) == -0x3FFFFFFF );
		
		// casting to short truncates to 16 bits and sign-extends
		i = 0x18000;
		assert( (short) i == -0x8000 );
	#endif
}